

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_39::getVirtualInterfaceTarget
          (anon_unknown_39 *this,Type *type,ASTContext *context,SourceRange range)

{
  Type *pTVar1;
  Symbol *pSVar2;
  SourceRange sourceRange;
  
  sourceRange.endLoc = range.startLoc;
  if (((ulong)(type->super_Symbol).name._M_str & 0x20) != 0) {
    sourceRange.startLoc = (SourceLocation)context;
    ASTContext::addDiag((ASTContext *)type,(DiagCode)0x4c0007,sourceRange);
  }
  pTVar1 = Type::getCanonicalType((Type *)this);
  pSVar2 = (Symbol *)pTVar1[1].super_Symbol.name._M_len;
  if (pSVar2 == (Symbol *)0x0) {
    pSVar2 = *(Symbol **)&pTVar1[1].super_Symbol;
  }
  return pSVar2;
}

Assistant:

const Symbol* getVirtualInterfaceTarget(const Type& type, const ASTContext& context,
                                        SourceRange range) {
    if (context.flags.has(ASTFlags::NonProcedural))
        context.addDiag(diag::DynamicNotProcedural, range);

    auto& vit = type.getCanonicalType().as<VirtualInterfaceType>();
    if (vit.modport)
        return vit.modport;

    return &vit.iface;
}